

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

bool __thiscall
cmCTestRunTest::EndTest(cmCTestRunTest *this,size_t completed,size_t total,bool started)

{
  string *psVar1;
  double dVar2;
  int iVar3;
  cmCTest *pcVar4;
  cmCTestTestHandler *this_00;
  cmProcess *this_01;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  pointer ppVar9;
  cmCTestTestProperties *pcVar10;
  ostream *poVar11;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 collapse;
  char *pcVar12;
  char cVar13;
  pointer ppVar14;
  char *pcVar15;
  string reason;
  string oldpath;
  ostringstream cmCTestLog_msg_11;
  string local_458;
  char buf [1024];
  
  bVar6 = this->TestHandler->MemCheck;
  if ((bool)bVar6 == false) {
    bVar5 = cmCTest::ShouldCompressTestOutput(this->CTest);
    if (!bVar5) {
      bVar6 = this->TestHandler->MemCheck;
      goto LAB_003115d3;
    }
LAB_003115e4:
    CompressOutput(this);
  }
  else {
LAB_003115d3:
    if (((bVar6 & 1) != 0) && (bVar5 = cmCTest::ShouldCompressMemCheckOutput(this->CTest), bVar5))
    goto LAB_003115e4;
  }
  WriteLogOutputTop(this,completed,total);
  reason._M_dataplus._M_p = (pointer)&reason.field_2;
  reason._M_string_length = 0;
  reason.field_2._M_local_buf[0] = '\0';
  if (started) {
    iVar8 = cmProcess::GetProcessStatus(this->TestProcess);
  }
  else {
    iVar8 = 1;
  }
  pcVar10 = this->TestProperties;
  iVar3 = this->TestProcess->ExitValue;
  ppVar14 = (pcVar10->RequiredRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar14 ==
      (pcVar10->RequiredRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar5 = false;
  }
  else {
    do {
      bVar5 = ppVar14 ==
              (this->TestProperties->RequiredRegularExpressions).
              super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar5) break;
      bVar7 = cmsys::RegularExpression::find(&ppVar14->first,(this->ProcessOutput)._M_dataplus._M_p)
      ;
      ppVar14 = ppVar14 + 1;
    } while (!bVar7);
    std::__cxx11::string::assign((char *)&reason);
    std::__cxx11::string::append((char *)&reason);
    pcVar10 = this->TestProperties;
    for (ppVar14 = (pcVar10->RequiredRegularExpressions).
                   super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppVar14 !=
        (pcVar10->RequiredRegularExpressions).
        super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppVar14 = ppVar14 + 1) {
      std::__cxx11::string::append((string *)&reason);
      std::__cxx11::string::append((char *)&reason);
      pcVar10 = this->TestProperties;
    }
    std::__cxx11::string::append((char *)&reason);
    pcVar10 = this->TestProperties;
  }
  ppVar14 = (pcVar10->ErrorRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar9 = (pcVar10->ErrorRegularExpressions).
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar14 != ppVar9) {
    for (; ppVar14 != ppVar9; ppVar14 = ppVar14 + 1) {
      bVar7 = cmsys::RegularExpression::find(&ppVar14->first,(this->ProcessOutput)._M_dataplus._M_p)
      ;
      if (bVar7) {
        std::__cxx11::string::assign((char *)&reason);
        std::__cxx11::string::append((char *)&reason);
        std::__cxx11::string::append((string *)&reason);
        bVar5 = true;
        std::__cxx11::string::append((char *)&reason);
        break;
      }
      ppVar9 = (this->TestProperties->ErrorRegularExpressions).
               super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  if (iVar8 == 2) {
    cVar13 = this->CTest->OutputTestOutputOnTestFailure;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
    std::operator<<((ostream *)buf,"***Exception: ");
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0xef,_cmCTestLog_msg_11,false);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_11);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
    iVar8 = cmProcess::GetExitException(this->TestProcess);
    switch(iVar8) {
    case 1:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
      std::operator<<((ostream *)buf,"SegFault");
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xf3,_cmCTestLog_msg_11,false);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_11);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
      (this->TestResult).Status = 2;
      break;
    case 2:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
      std::operator<<((ostream *)buf,"Illegal");
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xf7,_cmCTestLog_msg_11,false);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_11);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
      (this->TestResult).Status = 3;
      break;
    case 3:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
      std::operator<<((ostream *)buf,"Interrupt");
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xfb,_cmCTestLog_msg_11,false);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_11);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
      (this->TestResult).Status = 4;
      break;
    case 4:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
      std::operator<<((ostream *)buf,"Numerical");
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xff,_cmCTestLog_msg_11,false);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_11);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
      (this->TestResult).Status = 5;
      break;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
      std::operator<<((ostream *)buf,"Other");
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x103,_cmCTestLog_msg_11,false);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_11);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
      (this->TestResult).Status = 6;
    }
    goto LAB_00311cbf;
  }
  if (iVar8 == 5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
    std::operator<<((ostream *)buf,"***Timeout ");
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0xe8,_cmCTestLog_msg_11,false);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_11);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
    (this->TestResult).Status = 1;
LAB_0031182c:
    cVar13 = this->CTest->OutputTestOutputOnTestFailure;
  }
  else {
    if (iVar8 == 4) {
      if (bVar5) {
        pcVar10 = this->TestProperties;
        bVar5 = false;
      }
      else {
        pcVar10 = this->TestProperties;
        if (iVar3 == 0) {
          bVar5 = true;
        }
        else {
          bVar5 = (pcVar10->RequiredRegularExpressions).
                  super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (pcVar10->RequiredRegularExpressions).
                  super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      if (pcVar10->SkipReturnCode == iVar3 && -1 < pcVar10->SkipReturnCode) {
        (this->TestResult).Status = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
        std::operator<<((ostream *)buf,"***Skipped ");
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0xd7,_cmCTestLog_msg_11,false);
      }
      else {
        if (bVar5 == pcVar10->WillFail) {
          (this->TestResult).Status = 7;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
          poVar11 = std::operator<<((ostream *)buf,"***Failed  ");
          std::operator<<(poVar11,(string *)&reason);
          pcVar4 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                       ,0xe2,_cmCTestLog_msg_11,false);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_11);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
          goto LAB_0031182c;
        }
        (this->TestResult).Status = 9;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
        std::operator<<((ostream *)buf,"   Passed  ");
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0xdd,_cmCTestLog_msg_11,false);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
      std::operator<<((ostream *)buf,"***Not Run ");
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x109,_cmCTestLog_msg_11,false);
    }
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_11);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
    cVar13 = '\0';
  }
LAB_00311cbf:
  iVar8 = (this->TestResult).Status;
  sprintf(buf,"%6.2f sec",this->TestProcess->TotalTime);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_11);
  poVar11 = std::operator<<((ostream *)&cmCTestLog_msg_11,buf);
  std::operator<<(poVar11,"\n");
  pcVar4 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x10f,oldpath._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&oldpath);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_11);
  collapse = extraout_DL;
  if (cVar13 != '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_11);
    poVar11 = std::operator<<((ostream *)&cmCTestLog_msg_11,(string *)&this->ProcessOutput);
    std::endl<char,std::char_traits<char>>(poVar11);
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x113,oldpath._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&oldpath);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_11);
    collapse = extraout_DL_00;
  }
  poVar11 = this->TestHandler->LogFile;
  if (poVar11 != (ostream *)0x0) {
    poVar11 = std::operator<<(poVar11,"Test time = ");
    poVar11 = std::operator<<(poVar11,buf);
    std::endl<char,std::char_traits<char>>(poVar11);
    collapse = extraout_DL_01;
  }
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&oldpath,(SystemTools *)0x1,(bool)collapse);
  cmsys::SystemTools::ChangeDirectory(&this->TestProperties->Directory);
  DartProcessing(this);
  cmsys::SystemTools::ChangeDirectory(&oldpath);
  if ((started) && (this_00 = this->TestHandler, this_00->MemCheck == false)) {
    cmCTestTestHandler::CleanTestOutput
              (this_00,&this->ProcessOutput,
               (long)(&this_00->CustomMaximumPassedTestOutputSize)[(this->TestResult).Status != 9]);
  }
  psVar1 = &(this->TestResult).Reason;
  std::__cxx11::string::_M_assign((string *)psVar1);
  if (this->TestHandler->LogFile != (ostream *)0x0) {
    iVar3 = (this->TestResult).Status;
    pcVar15 = "Test Pass Reason";
    pcVar12 = "Test Passed.\n";
    if ((iVar3 != 0) && (iVar3 != 9)) {
      pcVar15 = "Test Fail Reason";
      pcVar12 = "Test Failed.\n";
    }
    dVar2 = this->TestProcess->TotalTime;
    sprintf((char *)&cmCTestLog_msg_11,"%02d:%02d:%02d",(ulong)(uint)(int)(dVar2 / 3600.0),
            (long)(int)(dVar2 / 60.0) % 0x3c & 0xffffffff,(long)(int)dVar2 % 0x3c & 0xffffffff);
    poVar11 = std::operator<<(this->TestHandler->LogFile,
                              "----------------------------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar11);
    poVar11 = this->TestHandler->LogFile;
    if ((this->TestResult).Reason._M_string_length != 0) {
      poVar11 = std::operator<<(poVar11,pcVar15);
      poVar11 = std::operator<<(poVar11,":\n");
      poVar11 = std::operator<<(poVar11,(string *)psVar1);
      pcVar12 = "\n";
    }
    std::operator<<(poVar11,pcVar12);
    poVar11 = std::operator<<(this->TestHandler->LogFile,"\"");
    poVar11 = std::operator<<(poVar11,(string *)this->TestProperties);
    poVar11 = std::operator<<(poVar11,"\" end time: ");
    cmCTest::CurrentTime_abi_cxx11_(&local_458,this->CTest);
    poVar11 = std::operator<<(poVar11,(string *)&local_458);
    poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
    poVar11 = std::operator<<(poVar11,"\"");
    poVar11 = std::operator<<(poVar11,(string *)this->TestProperties);
    poVar11 = std::operator<<(poVar11,"\" time elapsed: ");
    poVar11 = std::operator<<(poVar11,(char *)&cmCTestLog_msg_11);
    poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
    poVar11 = std::operator<<(poVar11,"----------------------------------------------------------");
    poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
    std::endl<char,std::char_traits<char>>(poVar11);
    std::__cxx11::string::~string((string *)&local_458);
  }
  if (started) {
    bVar5 = false;
    if ((this->TestHandler->MemCheck == false) &&
       (bVar5 = false, this->CompressionRatio <= 1.0 && this->CompressionRatio != 1.0)) {
      bVar5 = cmCTest::ShouldCompressTestOutput(this->CTest);
    }
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    (this->TestResult).CompressOutput = bVar5;
    (this->TestResult).ReturnValue = this->TestProcess->ExitValue;
    std::__cxx11::string::assign((char *)&(this->TestResult).CompletionStatus);
    (this->TestResult).ExecutionTime = this->TestProcess->TotalTime;
    MemCheckPostProcess(this);
    ComputeWeightedCost(this);
  }
  bVar5 = NeedsToRerun(this);
  if (!bVar5) {
    std::
    vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::push_back(&this->TestHandler->TestResults,&this->TestResult);
  }
  this_01 = this->TestProcess;
  if (this_01 != (cmProcess *)0x0) {
    cmProcess::~cmProcess(this_01);
  }
  operator_delete(this_01,0xc0);
  std::__cxx11::string::~string((string *)&oldpath);
  std::__cxx11::string::~string((string *)&reason);
  return iVar8 == 9;
}

Assistant:

bool cmCTestRunTest::EndTest(size_t completed, size_t total, bool started)
{
  if ((!this->TestHandler->MemCheck &&
      this->CTest->ShouldCompressTestOutput()) ||
      (this->TestHandler->MemCheck &&
      this->CTest->ShouldCompressMemCheckOutput()))
    {
    this->CompressOutput();
    }

  this->WriteLogOutputTop(completed, total);
  std::string reason;
  bool passed = true;
  int res = started ? this->TestProcess->GetProcessStatus()
                    : cmsysProcess_State_Error;
  int retVal = this->TestProcess->GetExitValue();
  std::vector<std::pair<cmsys::RegularExpression,
    std::string> >::iterator passIt;
  bool forceFail = false;
  bool outputTestErrorsToConsole = false;
  if (!this->TestProperties->RequiredRegularExpressions.empty())
    {
    bool found = false;
    for ( passIt = this->TestProperties->RequiredRegularExpressions.begin();
          passIt != this->TestProperties->RequiredRegularExpressions.end();
          ++ passIt )
      {
      if ( passIt->first.find(this->ProcessOutput.c_str()) )
        {
        found = true;
        reason = "Required regular expression found.";
        break;
        }
      }
    if ( !found )
      {
      reason = "Required regular expression not found.";
      forceFail = true;
      }
    reason +=  "Regex=[";
    for ( passIt = this->TestProperties->RequiredRegularExpressions.begin();
          passIt != this->TestProperties->RequiredRegularExpressions.end();
          ++ passIt )
      {
      reason += passIt->second;
      reason += "\n";
      }
    reason += "]";
    }
  if (!this->TestProperties->ErrorRegularExpressions.empty())
    {
    for ( passIt = this->TestProperties->ErrorRegularExpressions.begin();
          passIt != this->TestProperties->ErrorRegularExpressions.end();
          ++ passIt )
      {
      if ( passIt->first.find(this->ProcessOutput.c_str()) )
        {
        reason = "Error regular expression found in output.";
        reason += " Regex=[";
        reason += passIt->second;
        reason += "]";
        forceFail = true;
        break;
        }
      }
    }
  if (res == cmsysProcess_State_Exited)
    {
    bool success =
      !forceFail &&  (retVal == 0 ||
      this->TestProperties->RequiredRegularExpressions.size());
    if(this->TestProperties->SkipReturnCode >= 0
      && this->TestProperties->SkipReturnCode == retVal)
      {
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Skipped ");
      }
    else if((success && !this->TestProperties->WillFail)
      || (!success && this->TestProperties->WillFail))
      {
      this->TestResult.Status = cmCTestTestHandler::COMPLETED;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "   Passed  " );
      }
    else
      {
      this->TestResult.Status = cmCTestTestHandler::FAILED;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Failed  " << reason );
      outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
      }
    }
  else if ( res == cmsysProcess_State_Expired )
    {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Timeout ");
    this->TestResult.Status = cmCTestTestHandler::TIMEOUT;
    outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
    }
  else if ( res == cmsysProcess_State_Exception )
    {
    outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Exception: ");
    switch(this->TestProcess->GetExitException())
      {
      case cmsysProcess_Exception_Fault:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "SegFault");
        this->TestResult.Status = cmCTestTestHandler::SEGFAULT;
        break;
      case cmsysProcess_Exception_Illegal:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Illegal");
        this->TestResult.Status = cmCTestTestHandler::ILLEGAL;
        break;
      case cmsysProcess_Exception_Interrupt:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Interrupt");
        this->TestResult.Status = cmCTestTestHandler::INTERRUPT;
        break;
      case cmsysProcess_Exception_Numerical:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Numerical");
        this->TestResult.Status = cmCTestTestHandler::NUMERICAL;
        break;
      default:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Other");
        this->TestResult.Status = cmCTestTestHandler::OTHER_FAULT;
      }
    }
  else //cmsysProcess_State_Error
    {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Not Run ");
    }

  passed = this->TestResult.Status == cmCTestTestHandler::COMPLETED;
  char buf[1024];
  sprintf(buf, "%6.2f sec", this->TestProcess->GetTotalTime());
  cmCTestLog(this->CTest, HANDLER_OUTPUT, buf << "\n" );

  if ( outputTestErrorsToConsole )
    {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, this->ProcessOutput << std::endl );
    }

  if ( this->TestHandler->LogFile )
    {
    *this->TestHandler->LogFile << "Test time = " << buf << std::endl;
    }

  // Set the working directory to the tests directory
  std::string oldpath = cmSystemTools::GetCurrentWorkingDirectory();
  cmSystemTools::ChangeDirectory(this->TestProperties->Directory);

  this->DartProcessing();

  // restore working directory
  cmSystemTools::ChangeDirectory(oldpath);


  // if this is doing MemCheck then all the output needs to be put into
  // Output since that is what is parsed by cmCTestMemCheckHandler
  if(!this->TestHandler->MemCheck && started)
    {
    this->TestHandler->CleanTestOutput(this->ProcessOutput,
      static_cast<size_t>
      (this->TestResult.Status == cmCTestTestHandler::COMPLETED ?
      this->TestHandler->CustomMaximumPassedTestOutputSize :
      this->TestHandler->CustomMaximumFailedTestOutputSize));
    }
  this->TestResult.Reason = reason;
  if (this->TestHandler->LogFile)
    {
    bool pass = true;
    const char* reasonType = "Test Pass Reason";
    if(this->TestResult.Status != cmCTestTestHandler::COMPLETED &&
       this->TestResult.Status != cmCTestTestHandler::NOT_RUN)
      {
      reasonType = "Test Fail Reason";
      pass = false;
      }
    double ttime = this->TestProcess->GetTotalTime();
    int hours = static_cast<int>(ttime / (60 * 60));
    int minutes = static_cast<int>(ttime / 60) % 60;
    int seconds = static_cast<int>(ttime) % 60;
    char buffer[100];
    sprintf(buffer, "%02d:%02d:%02d", hours, minutes, seconds);
    *this->TestHandler->LogFile
      << "----------------------------------------------------------"
      << std::endl;
    if(!this->TestResult.Reason.empty())
      {
      *this->TestHandler->LogFile << reasonType << ":\n"
        << this->TestResult.Reason << "\n";
      }
    else
      {
      if(pass)
        {
        *this->TestHandler->LogFile << "Test Passed.\n";
        }
      else
        {
        *this->TestHandler->LogFile << "Test Failed.\n";
        }
      }
    *this->TestHandler->LogFile << "\"" << this->TestProperties->Name
      << "\" end time: " << this->CTest->CurrentTime() << std::endl
      << "\"" << this->TestProperties->Name << "\" time elapsed: "
      << buffer << std::endl
      << "----------------------------------------------------------"
      << std::endl << std::endl;
    }
  // if the test actually started and ran
  // record the results in TestResult
  if(started)
    {
    bool compress = !this->TestHandler->MemCheck &&
      this->CompressionRatio < 1 &&
      this->CTest->ShouldCompressTestOutput();
    this->TestResult.Output = compress ? this->CompressedOutput
      : this->ProcessOutput;
    this->TestResult.CompressOutput = compress;
    this->TestResult.ReturnValue = this->TestProcess->GetExitValue();
    this->TestResult.CompletionStatus = "Completed";
    this->TestResult.ExecutionTime = this->TestProcess->GetTotalTime();
    this->MemCheckPostProcess();
    this->ComputeWeightedCost();
    }
  // If the test does not need to rerun push the current TestResult onto the
  // TestHandler vector
  if(!this->NeedsToRerun())
    {
    this->TestHandler->TestResults.push_back(this->TestResult);
    }
  delete this->TestProcess;
  return passed;
}